

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  long lVar1;
  ConfigData *pCVar2;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *this_00;
  ConfigData *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Config_001ef4f8;
  lVar1 = *(long *)(*(long *)&in_RDI[1].field_0x20 + -0x18);
  pCVar2 = in_RDI + 1;
  this_00 = (vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
            std::ios::rdbuf();
  std::ios::rdbuf((streambuf *)(&pCVar2->field_0x20 + lVar1));
  Stream::release((Stream *)in_RDI);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector(this_00);
  std::ostream::~ostream(&in_RDI[1].field_0x20);
  ConfigData::~ConfigData(in_RDI);
  SharedImpl<Catch::IConfig>::~SharedImpl((SharedImpl<Catch::IConfig> *)0x1804f4);
  return;
}

Assistant:

virtual ~Config() {
            m_os.rdbuf( std::cout.rdbuf() );
            m_stream.release();
        }